

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::ResetByteCodeGenVisitState(FunctionBody *this)

{
  ByteBlock **ppBVar1;
  FunctionBody *this_local;
  
  UnlockCounters(this);
  ppBVar1 = Memory::WriteBarrierPtr::operator_cast_to_ByteBlock__
                      ((WriteBarrierPtr *)&this->byteCodeBlock);
  if (*ppBVar1 == (ByteBlock *)0x0) {
    ResetLiteralRegexes(this);
  }
  return;
}

Assistant:

void FunctionBody::ResetByteCodeGenVisitState()
    {
        // This function body is about to be visited by the byte code generator after defer-parsing it. Since the previous visit
        // pass may have failed, we need to restore state that is tracked on the function body by the visit pass.
        // Note: do not reset literal regexes if the function has already been compiled (e.g., is a parsed function enclosed by a
        // redeferred function) as we will not use the count of literals anyway, and the counters may be accessed by the background thread.

        DebugOnly(this->UnlockCounters());

        if (this->byteCodeBlock == nullptr)
        {
            ResetLiteralRegexes();
        }
    }